

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

void free(void *__ptr)

{
  memstate mVar1;
  guard *pgVar2;
  hdbg_info *phVar3;
  memdesc *pmVar4;
  memdesc_node *pmVar5;
  _Bool _Var6;
  uint uVar7;
  int iVar8;
  undefined8 in_RAX;
  char *pcVar9;
  ulong uVar10;
  hdbg_info *phVar11;
  char *cp;
  memdesc *pmVar12;
  char *msg;
  char *cp_1;
  undefined8 local_28;
  
  if (__ptr == (void *)0x0) {
    return;
  }
  local_28 = in_RAX;
  _Var6 = use_hdmp();
  if (!_Var6) {
    if (__ptr <= malloc_headroom + 0xffff && malloc_headroom <= __ptr) {
      return;
    }
LAB_0010192e:
    (*real_free)(__ptr);
    return;
  }
  pmVar12 = *(memdesc **)((long)__ptr + -0x10);
  mVar1 = *(memstate *)((long)&pmVar12->data[1].desc + pmVar12->len);
  if (mVar1 != pmVar12->data->state) {
    pcVar9 = "head state != tail state. memory over/underrun";
LAB_0010198a:
    die(pcVar9);
  }
  if (mVar1 != mem_allocated) {
    pcVar9 = "free() passed non-allocated memory";
    goto LAB_0010198a;
  }
  if (pmVar12->data != (guard *)((long)__ptr + -0x10)) {
    pcVar9 = "internal integrity error";
    goto LAB_0010198a;
  }
  getstacktrace(pmVar12->stack,(int)hdbg.maxframes);
  pgVar2 = pmVar12->data;
  local_28 = 0xdeaddead;
  uVar7 = (uint)pmVar12->len;
  if ((0 < (int)uVar7) && (hdbg.doFill != 0)) {
    uVar10 = 0;
    do {
      *(undefined1 *)((long)&pgVar2[1].desc + uVar10) =
           *(undefined1 *)((long)&local_28 + (ulong)((uint)uVar10 & 3));
      uVar10 = uVar10 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar10);
  }
  *(undefined4 *)((long)&pmVar12->data[1].desc + pmVar12->len) = 0x5a5a5a5a;
  pmVar12->data->state = mem_free;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&heap_lock);
  if (iVar8 == 0) {
    hdbg.stats.free_calls = hdbg.stats.free_calls + 1;
    hdbg.stats.alloc_total = hdbg.stats.alloc_total - pmVar12->len;
    phVar3 = (hdbg_info *)(pmVar12->node).tqe_next;
    phVar11 = phVar3;
    if (phVar3 == (hdbg_info *)0x0) {
      phVar11 = &hdbg;
    }
    ((memdesc_node *)&phVar11->heap)->tqe_prev = (pmVar12->node).tqe_prev;
    *(pmVar12->node).tqe_prev = (memdesc *)phVar3;
    (pmVar12->node).tqe_next = hdbg.freelist.tqh_first;
    pmVar5 = &(hdbg.freelist.tqh_first)->node;
    if (hdbg.freelist.tqh_first == (memdesc *)0x0) {
      pmVar5 = (memdesc_node *)&hdbg.freelist;
    }
    pmVar5->tqe_prev = (memdesc **)pmVar12;
    hdbg.freelist.tqh_first = pmVar12;
    (pmVar12->node).tqe_prev = &hdbg.freelist.tqh_first;
    if (hdbg.freelistsize == hdbg.freelistmax) {
      pmVar12 = (hdbg.freelist.tqh_last[1]->node).tqe_next;
      pmVar4 = (pmVar12->node).tqe_next;
      pmVar5 = &pmVar4->node;
      if (pmVar4 == (memdesc *)0x0) {
        pmVar5 = (memdesc_node *)&hdbg.freelist;
      }
      pmVar5->tqe_prev = (pmVar12->node).tqe_prev;
      *(pmVar12->node).tqe_prev = pmVar4;
    }
    else {
      hdbg.freelistsize = hdbg.freelistsize + 1;
      pmVar12 = (memdesc *)0x0;
    }
    iVar8 = pthread_mutex_unlock((pthread_mutex_t *)&heap_lock);
    if (iVar8 == 0) {
      if (pmVar12 == (memdesc *)0x0) {
        return;
      }
      __ptr = pmVar12->base;
      sanity_freenode(pmVar12);
      iVar8 = pthread_mutex_lock((pthread_mutex_t *)&descriptors_lock);
      if (iVar8 != 0) goto LAB_00101949;
      if ((pmVar12->len < hdbg.rememberbigger) || (hdbg.maxbig <= hdbg.numbig)) {
        (pmVar12->node).tqe_next = (memdesc *)0x0;
        (pmVar12->node).tqe_prev = hdbg.descriptors.tqh_last;
        *hdbg.descriptors.tqh_last = pmVar12;
        hdbg.descriptors.tqh_last = (memdesc **)pmVar12;
      }
      else {
        (pmVar12->node).tqe_next = (memdesc *)0x0;
        (pmVar12->node).tqe_prev = hdbg.freebig.tqh_last;
        *hdbg.freebig.tqh_last = pmVar12;
        hdbg.numbig = hdbg.numbig + 1;
        hdbg.freebig.tqh_last = (memdesc **)pmVar12;
      }
      iVar8 = pthread_mutex_unlock((pthread_mutex_t *)&descriptors_lock);
      if (iVar8 == 0) {
        if (__ptr <= malloc_headroom + 0xffff && malloc_headroom <= __ptr) {
          return;
        }
        goto LAB_0010192e;
      }
    }
    pcVar9 = strerror(iVar8);
    msg = "unlock failed: %s";
  }
  else {
LAB_00101949:
    pcVar9 = strerror(iVar8);
    msg = "lock failed: %s";
  }
  die(msg,pcVar9);
}

Assistant:

void free(void *p) {
    if (p == 0)
        return;
    if (!use_hdmp()) {
        if (!headroom(p))
            real_free(p);
        return;
    }

    struct guard *guard = (struct guard *)p - 1;
    struct memdesc *desc = guard->desc;

    if (get_state(desc) != mem_allocated)
        die("free() passed non-allocated memory");
    if (desc->data != guard)
        die("internal integrity error");

    getstacktrace(desc->stack, hdbg.maxframes);
    fill(desc->data + 1, desc->len, 0xdeaddead);
    set_state(desc, mem_free);

    LOCK(&heap_lock);

    hdbg.stats.free_calls++;
    hdbg.stats.alloc_total -= desc->len;
    TAILQ_REMOVE(&hdbg.heap, desc, node);

    TAILQ_INSERT_HEAD(&hdbg.freelist, desc, node);
    // put this block on the freelist, and extract the oldest block if the list
    // is too big. We will actually free the oldest one now, so we have
    // maintained some hysteresis between the application calling free() and
    // actually freeing the memory.
    if (hdbg.freelistsize == hdbg.freelistmax) {
        desc = TAILQ_LAST(&hdbg.freelist, memdesc_list);
        TAILQ_REMOVE(&hdbg.freelist, desc, node);
    } else {
        hdbg.freelistsize++;
        desc = 0;
    }
    UNLOCK(&heap_lock);

    if (desc) {
        void *p = desc->base;
        free_desc(desc);
        if (!headroom(p))
            real_free(p);
    }
}